

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::AddEntryPointToEntryPointList
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  bool bVar1;
  Type pSVar2;
  ThreadContext *pTVar3;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  Type TVar4;
  RecyclerWeakReference<Js::FunctionEntryPointInfo> *local_30;
  
  pSVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  pTVar3 = pSVar2->threadContext;
  bVar1 = pTVar3->disableExpiration;
  pTVar3->disableExpiration = true;
  this_00 = (this->entryPoints).ptr;
  local_30 = Memory::Recycler::CreateWeakReferenceHandle<Js::FunctionEntryPointInfo>
                       (pSVar2->recycler,entryPointInfo);
  TVar4 = SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
          ::Add(this_00,&local_30);
  entryPointInfo->entryPointIndex = TVar4;
  pTVar3->disableExpiration = bVar1;
  return;
}

Assistant:

void FunctionBody::AddEntryPointToEntryPointList(FunctionEntryPointInfo* entryPointInfo)
    {
        ThreadContext::AutoDisableExpiration disableExpiration(this->m_scriptContext->GetThreadContext());

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        entryPointInfo->entryPointIndex = this->entryPoints->Add(recycler->CreateWeakReferenceHandle(entryPointInfo));
    }